

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

size_type __thiscall ghc::filesystem::path::root_name_length(path *this)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  size_type sVar4;
  ulong in_RDI;
  size_type pos;
  
  uVar2 = std::__cxx11::string::length();
  if ((((2 < uVar2) && (pcVar3 = (char *)std::__cxx11::string::operator[](in_RDI), *pcVar3 == '/'))
      && (pcVar3 = (char *)std::__cxx11::string::operator[](in_RDI), *pcVar3 == '/')) &&
     (pcVar3 = (char *)std::__cxx11::string::operator[](in_RDI), *pcVar3 != '/')) {
    pcVar3 = (char *)std::__cxx11::string::operator[](in_RDI);
    iVar1 = isprint((int)*pcVar3);
    if (iVar1 != 0) {
      sVar4 = std::__cxx11::string::find((char)in_RDI,0x2f);
      if (sVar4 != 0xffffffffffffffff) {
        return sVar4;
      }
      sVar4 = std::__cxx11::string::length();
      return sVar4;
    }
  }
  return 0;
}

Assistant:

GHC_INLINE path::string_type::size_type path::root_name_length() const noexcept
{
#ifdef GHC_OS_WINDOWS
    if (_path.length() >= _prefixLength + 2 && std::toupper(static_cast<unsigned char>(_path[_prefixLength])) >= 'A' && std::toupper(static_cast<unsigned char>(_path[_prefixLength])) <= 'Z' && _path[_prefixLength + 1] == ':') {
        return 2;
    }
#endif
    if (_path.length() > _prefixLength + 2 && _path[_prefixLength] == preferred_separator && _path[_prefixLength + 1] == preferred_separator && _path[_prefixLength + 2] != preferred_separator && std::isprint(_path[_prefixLength + 2])) {
        impl_string_type::size_type pos = _path.find(preferred_separator, _prefixLength + 3);
        if (pos == impl_string_type::npos) {
            return _path.length();
        }
        else {
            return pos;
        }
    }
    return 0;
}